

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution3d.cpp
# Opt level: O0

void __thiscall
ncnn::Convolution3D::make_padding
          (Convolution3D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  void *in_RCX;
  long in_RSI;
  Mat *in_RDI;
  Option opt_b_2;
  int dpad_1;
  int hpad_1;
  int wpad_1;
  Option opt_b_1;
  int dpad;
  int hpad;
  int wpad;
  Option opt_b;
  int kernel_extent_d;
  int kernel_extent_h;
  int kernel_extent_w;
  int d;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  float in_stack_fffffffffffffec4;
  float fVar1;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int left;
  int in_stack_fffffffffffffed0;
  int bottom;
  int in_stack_fffffffffffffed4;
  Mat *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  Option *in_stack_ffffffffffffff08;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  int local_8c;
  int local_88;
  int local_84;
  undefined1 local_80 [8];
  undefined8 local_78;
  float local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  void *local_28;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_38 = *(int *)&in_RDI[3].refcount * (*(int *)((long)&in_RDI[2].cstep + 4) + -1) + 1;
  local_3c = *(int *)((long)&in_RDI[3].refcount + 4) * (*(int *)&in_RDI[3].data + -1) + 1;
  local_40 = (float)((int)in_RDI[3].elemsize * (*(int *)((long)&in_RDI[3].data + 4) + -1) + 1);
  local_28 = in_RCX;
  ncnn::Mat::operator=
            ((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (Mat *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  if ((((*(int *)&in_RDI[3].allocator < 1) && (*(int *)((long)&in_RDI[3].allocator + 4) < 1)) &&
      (in_RDI[3].dims < 1)) && (((in_RDI[3].w < 1 && (in_RDI[3].h < 1)) && (in_RDI[3].d < 1)))) {
    if (((*(int *)&in_RDI[3].allocator == -0xe9) &&
        (*(int *)((long)&in_RDI[3].allocator + 4) == -0xe9)) &&
       ((in_RDI[3].dims == -0xe9 &&
        (((in_RDI[3].w == -0xe9 && (in_RDI[3].h == -0xe9)) && (in_RDI[3].d == -0xe9)))))) {
      local_84 = (local_38 +
                 ((local_2c + -1) / *(int *)((long)&in_RDI[3].elemsize + 4)) *
                 *(int *)((long)&in_RDI[3].elemsize + 4)) - local_2c;
      local_88 = (local_3c + ((local_30 + -1) / in_RDI[3].elempack) * in_RDI[3].elempack) - local_30
      ;
      local_8c = ((int)local_40 +
                 ((local_34 + -1) / *(int *)&in_RDI[3].field_0x1c) * *(int *)&in_RDI[3].field_0x1c)
                 - local_34;
      if (((0 < local_84) || (0 < local_88)) || (0 < local_8c)) {
        left = local_38;
        bottom = local_3c;
        fVar1 = local_40;
        memcpy(local_d0,local_28,0x40);
        local_c8 = *(undefined8 *)((long)local_28 + 0x10);
        copy_make_border_3d(in_stack_fffffffffffffee0,in_RDI,(int)fVar1,bottom,left,local_88 / 2,
                            in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
                            in_stack_ffffffffffffff00,in_stack_fffffffffffffec4,
                            in_stack_ffffffffffffff08);
      }
    }
    else if (((*(int *)&in_RDI[3].allocator == -0xea) &&
             (*(int *)((long)&in_RDI[3].allocator + 4) == -0xea)) &&
            ((in_RDI[3].dims == -0xea &&
             (((in_RDI[3].w == -0xea && (in_RDI[3].h == -0xea)) && (in_RDI[3].d == -0xea)))))) {
      if (((0 < (local_38 +
                ((local_2c + -1) / *(int *)((long)&in_RDI[3].elemsize + 4)) *
                *(int *)((long)&in_RDI[3].elemsize + 4)) - local_2c) ||
          (0 < (local_3c + ((local_30 + -1) / in_RDI[3].elempack) * in_RDI[3].elempack) - local_30))
         || (0 < ((int)local_40 +
                 ((local_34 + -1) / *(int *)&in_RDI[3].field_0x1c) * *(int *)&in_RDI[3].field_0x1c)
                 - local_34)) {
        fVar1 = local_40;
        memcpy(&stack0xfffffffffffffee0,local_28,0x40);
        copy_make_border_3d(in_stack_fffffffffffffee0,in_RDI,in_stack_fffffffffffffed4,
                            in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                            in_stack_fffffffffffffec8,in_stack_fffffffffffffef0,
                            in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,fVar1,
                            in_stack_ffffffffffffff08);
      }
    }
  }
  else {
    memcpy(local_80,local_28,0x40);
    local_78 = *(undefined8 *)((long)local_28 + 0x10);
    copy_make_border_3d(in_stack_fffffffffffffee0,in_RDI,in_stack_fffffffffffffed4,
                        in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                        in_stack_fffffffffffffec8,in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,
                        in_stack_fffffffffffffec4,in_stack_ffffffffffffff08);
  }
  return;
}

Assistant:

void Convolution3D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extent_d = dilation_d * (kernel_d - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || pad_front > 0 || pad_behind > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border_3d(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, pad_front, pad_behind, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233 && pad_front == -233 && pad_behind == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        int dpad = kernel_extent_d + (d - 1) / stride_d * stride_d - d;
        if (wpad > 0 || hpad > 0 || dpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border_3d(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, dpad / 2, dpad - dpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234 && pad_front == -234 && pad_behind == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        int dpad = kernel_extent_d + (d - 1) / stride_d * stride_d - d;
        if (wpad > 0 || hpad > 0 || dpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border_3d(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, dpad / 2, dpad - dpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}